

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall ON_Interval::Includes(ON_Interval *this,double t,bool bTestOpenInterval)

{
  double dVar1;
  double dVar2;
  
  if (((ABS(t) < 1.23432101234321e+308) &&
      (dVar1 = this->m_t[0], ABS(dVar1) < 1.23432101234321e+308)) &&
     (dVar2 = this->m_t[1], ABS(dVar2) < 1.23432101234321e+308)) {
    if (bTestOpenInterval) {
      if (this->m_t[dVar2 < dVar1] < t) {
        return t < this->m_t[dVar1 <= dVar2];
      }
    }
    else if (this->m_t[dVar2 < dVar1] <= t) {
      return t <= this->m_t[dVar1 <= dVar2];
    }
  }
  return false;
}

Assistant:

bool
ON_Interval::Includes( double t, bool bTestOpenInterval) const
{
  bool rc = false;
  if ( ON_IS_VALID(t) && ON_IS_VALID(m_t[0]) && ON_IS_VALID(m_t[1]) )
  {
    int i = (m_t[0] <= m_t[1]) ? 0 : 1;
    if ( bTestOpenInterval )
    {
      rc = ( m_t[i] < t && t < m_t[1-i] ) ? true : false;
    }
    else
    {
      rc = ( m_t[i] <= t && t <= m_t[1-i] ) ? true : false;
    }
  }
  return rc;
}